

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O0

void __thiscall cpp_sgr::color::color(color *this,ANSIColor code,bool foreground)

{
  ANSIColor local_54;
  string local_38;
  undefined1 local_15;
  ANSIColor local_14;
  bool foreground_local;
  color *pcStack_10;
  ANSIColor code_local;
  color *this_local;
  
  local_54 = code;
  if (!foreground) {
    local_54 = code + 10;
  }
  local_15 = foreground;
  local_14 = code;
  pcStack_10 = this;
  std::__cxx11::to_string(&local_38,local_54);
  sgr::sgr(&this->super_sgr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

color(const ANSIColor code, bool foreground) :
			sgr(std::to_string(foreground ? code : (code + 10)))
		{}